

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int xml2_read_cb(void *context,char *buffer,int len)

{
  size_t sStack_50;
  int r;
  size_t used;
  size_t outbytes;
  void *d;
  xar *xar;
  archive_read *a;
  char *pcStack_20;
  int len_local;
  char *buffer_local;
  void *context_local;
  
  sStack_50 = 0;
  d = (void *)**(long **)((long)context + 0x818);
  if (*(long *)((long)d + 0x40) == 0) {
    context_local._4_4_ = 0;
  }
  else {
    used = (size_t)len;
    outbytes = (size_t)buffer;
    xar = (xar *)context;
    a._4_4_ = len;
    pcStack_20 = buffer;
    buffer_local = (char *)context;
    context_local._4_4_ =
         rd_contents((archive_read *)context,(void **)&outbytes,&used,&stack0xffffffffffffffb0,
                     *(uint64_t *)((long)d + 0x40));
    if (context_local._4_4_ == 0) {
      __archive_read_consume((archive_read *)xar,sStack_50);
      *(size_t *)((long)d + 0x40) = *(long *)((long)d + 0x40) - sStack_50;
      *(size_t *)d = sStack_50 + *d;
      *(size_t *)((long)d + 0x48) = used + *(long *)((long)d + 0x48);
      context_local._4_4_ = (int)used;
    }
  }
  return context_local._4_4_;
}

Assistant:

static int
xml2_read_cb(void *context, char *buffer, int len)
{
	struct archive_read *a;
	struct xar *xar;
	const void *d;
	size_t outbytes;
	size_t used = 0;
	int r;

	a = (struct archive_read *)context;
	xar = (struct xar *)(a->format->data);

	if (xar->toc_remaining <= 0)
		return (0);
	d = buffer;
	outbytes = len;
	r = rd_contents(a, &d, &outbytes, &used, xar->toc_remaining);
	if (r != ARCHIVE_OK)
		return (r);
	__archive_read_consume(a, used);
	xar->toc_remaining -= used;
	xar->offset += used;
	xar->toc_total += outbytes;
	PRINT_TOC(buffer, len);

	return ((int)outbytes);
}